

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::OrderedPortConnectionSyntax::setChild
          (OrderedPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  
  ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar4 = *ppSVar3;
  if (index == 0) {
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
         = pSVar4->previewNode;
    uVar2 = *(undefined4 *)&pSVar4->field_0x4;
    pSVar1 = pSVar4->parent;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar4->kind;
    *(undefined4 *)
     &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
         = uVar2;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         pSVar1;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar4 + 1);
    pSVar1 = pSVar4[1].previewNode;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar4[1].parent;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar4 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar4 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar4 = *ppSVar3;
    }
    (this->expr).ptr = (PropertyExprSyntax *)pSVar4;
  }
  return;
}

Assistant:

void OrderedPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}